

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Data.cpp
# Opt level: O3

bool __thiscall
SRUP_MSG_SYNDICATED_DATA::DeSerialize(SRUP_MSG_SYNDICATED_DATA *this,uint8_t *serial_data)

{
  uint64_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint64_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  long lVar7;
  uint8_t bytes [2];
  undefined2 local_2a;
  
  *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_msgtype = serial_data[1];
  uVar1 = *(uint64_t *)(serial_data + 2);
  puVar4 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sequence_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sequence_ID = puVar4;
  *puVar4 = uVar1;
  uVar1 = *(uint64_t *)(serial_data + 10);
  puVar4 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sender_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sender_ID = puVar4;
  *puVar4 = uVar1;
  local_2a = *(undefined2 *)(serial_data + 0x12);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  puVar5 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token = puVar5;
  memcpy(puVar5,serial_data + 0x14,(ulong)uVar2);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len = uVar2;
  local_2a = *(undefined2 *)(serial_data + (ulong)uVar2 + 0x14);
  uVar3 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sig_len = uVar3;
  puVar5 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_signature;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  uVar6 = (ulong)uVar3;
  puVar5 = (uint8_t *)operator_new__(uVar6);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_signature = puVar5;
  memcpy(puVar5,serial_data + (uVar2 + 0x16),uVar6);
  lVar7 = (uVar2 + 0x16) + uVar6;
  local_2a = *(undefined2 *)(serial_data + lVar7);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  puVar5 = (this->super_SRUP_MSG_DATA).m_data_ID;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_DATA).m_data_ID = puVar5;
  uVar6 = (ulong)((int)lVar7 + 2);
  memcpy(puVar5,serial_data + uVar6,(ulong)uVar2);
  (this->super_SRUP_MSG_DATA).m_data_ID_len = uVar2;
  lVar7 = uVar6 + uVar2;
  local_2a = *(undefined2 *)(serial_data + lVar7);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  puVar5 = (this->super_SRUP_MSG_DATA).m_data;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_DATA).m_data = puVar5;
  memcpy(puVar5,serial_data + lVar7 + 2,(ulong)uVar2);
  (this->super_SRUP_MSG_DATA).m_data_len = uVar2;
  uVar1 = *(uint64_t *)(serial_data + lVar7 + (ulong)uVar2 + 2);
  operator_delete(this->m_source_ID);
  puVar4 = (uint64_t *)operator_new(8);
  this->m_source_ID = puVar4;
  *puVar4 = uVar1;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_DATA::DeSerialize(const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new unsigned char[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Next the data_ID...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_data_ID;
    m_data_ID = new uint8_t[x+1];
    std::memcpy(m_data_ID, (uint8_t *) serial_data + p, x);
    m_data_ID_len = x;
    p+=x;

    // ...and now the data
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    delete[] m_data;
    m_data = new uint8_t[x+1];
    std::memcpy(m_data, (uint8_t *) serial_data + p, x);
    m_data_len = x;
    p+=x;

    // And finally we have to unmarshall the source ID...
    uint8_t src_bytes[8];
    for (unsigned char & src_byte : src_bytes)
    {
        std::memcpy(&src_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the source ID
    delete(m_source_ID);
    m_source_ID = new uint64_t;
    std::memcpy(m_source_ID, src_bytes, 8);

    return true;
}